

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  ostream *this;
  string local_128;
  undefined1 local_108 [8];
  NanoDebugger debugger;
  allocator<char> local_39;
  string local_38 [8];
  string file;
  char **argv_local;
  int argc_local;
  
  file.field_2._8_8_ = argv;
  if (argc < 1) {
    this = std::operator<<((ostream *)&std::cout,"Usage NanoDebugger.exe [FILE]");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  __s = *(char **)(file.field_2._8_8_ + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,__s,&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::__cxx11::string::string((string *)&local_128,local_38);
  NanoDebugger::NanoDebugger((NanoDebugger *)local_108,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  NanoDebugger::debug((NanoDebugger *)local_108);
  NanoDebugger::~NanoDebugger((NanoDebugger *)local_108);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	if (argc < 1) {
		std::cout << "Usage NanoDebugger.exe [FILE]" << std::endl;
	}
	std::string file = (argv[1]);
	NanoDebugger debugger(file);
	debugger.debug();
	return 0;
}